

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void jmp_patchval(FuncState *fs,BCPos list,BCPos vtarget,BCReg reg,BCPos dtarget)

{
  ushort uVar1;
  int iVar2;
  BCPos BVar3;
  uint uVar4;
  FuncState *fs_00;
  long lVar5;
  
  if (list != 0xffffffff) {
    fs_00 = (FuncState *)fs->bcbase;
    do {
      uVar1 = fs_00->varmap[(ulong)list * 4 + -0x2d];
      iVar2 = jmp_patchtestreg(fs_00,list,reg);
      BVar3 = dtarget;
      if (iVar2 != 0) {
        BVar3 = vtarget;
      }
      uVar4 = (BVar3 - list) + 0x7fff;
      if (0xffff < uVar4) {
        err_syntax(fs->ls,LJ_ERR_XJUMP);
      }
      lVar5 = (ulong)uVar1 - 0x8000;
      fs_00 = (FuncState *)fs->bcbase;
      fs_00->varmap[(ulong)list * 4 + -0x2d] = (VarIndex)uVar4;
    } while ((lVar5 != -1) && (list = list + (int)lVar5 + 1, list != 0xffffffff));
  }
  return;
}

Assistant:

static void jmp_patchval(FuncState *fs, BCPos list, BCPos vtarget,
			 BCReg reg, BCPos dtarget)
{
  while (list != NO_JMP) {
    BCPos next = jmp_next(fs, list);
    if (jmp_patchtestreg(fs, list, reg))
      jmp_patchins(fs, list, vtarget);  /* Jump to target with value. */
    else
      jmp_patchins(fs, list, dtarget);  /* Jump to default target. */
    list = next;
  }
}